

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O3

int parse_ignore(ly_ctx *ctx,char *data,char *endstr,uint *len)

{
  char *pcVar1;
  int iVar2;
  size_t sVar3;
  ulong __n;
  
  if (*data != '\0') {
    sVar3 = strlen(endstr);
    __n = sVar3 & 0xffffffff;
    do {
      iVar2 = strncmp(data,endstr,__n);
      if (iVar2 == 0) {
        *len = (uint)sVar3;
        return 0;
      }
      sVar3 = (size_t)((uint)sVar3 + 1);
      pcVar1 = data + 1;
      data = data + 1;
    } while (*pcVar1 != '\0');
  }
  ly_vlog(ctx,LYE_XML_MISS,LY_VLOG_NONE,(void *)0x0,"closing sequence",endstr);
  return 1;
}

Assistant:

static int
parse_ignore(struct ly_ctx *ctx, const char *data, const char *endstr, unsigned int *len)
{
    unsigned int slen;
    const char *c = data;

    slen = strlen(endstr);

    while (*c && strncmp(c, endstr, slen)) {
        c++;
    }
    if (!*c) {
        LOGVAL(ctx, LYE_XML_MISS, LY_VLOG_NONE, NULL, "closing sequence", endstr);
        return EXIT_FAILURE;
    }
    c += slen;

    *len = c - data;
    return EXIT_SUCCESS;
}